

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

uint64_t __thiscall
fmp4_stream::ingest_stream::get_media_segment_data
          (ingest_stream *this,size_t index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *media_seg_dat)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  uint64_t __new_size;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar2 = *(long *)&this->media_fragment_;
  uVar4 = (*(long *)&this->field_0xd8 - lVar2 >> 3) * 0x1cac083126e978d5;
  if (uVar4 < index || uVar4 - index == 0) {
    __new_size = 0;
  }
  else {
    lVar8 = index * 1000;
    __new_size = *(long *)(lVar2 + 0x168 + lVar8) + *(long *)(lVar2 + 0x100 + lVar8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(media_seg_dat,__new_size);
    lVar2 = *(long *)&this->media_fragment_;
    lVar3 = *(long *)(lVar2 + 0xd0 + lVar8);
    if (*(long *)(lVar2 + 0xd8 + lVar8) == lVar3) {
      lVar9 = 0;
    }
    else {
      lVar7 = 0;
      uVar4 = 0;
      lVar9 = 0;
      do {
        pvVar1 = *(void **)(lVar3 + 0x48 + lVar7);
        sVar5 = *(long *)(lVar3 + 0x50 + lVar7) - (long)pvVar1;
        if (sVar5 != 0) {
          memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                  ._M_impl.super__Vector_impl_data._M_start,pvVar1,sVar5);
          lVar2 = *(long *)&this->media_fragment_;
        }
        lVar2 = *(long *)(lVar2 + 0xd0 + lVar8);
        lVar2 = (*(code *)**(undefined8 **)(lVar2 + lVar7))(lVar2 + lVar7);
        lVar9 = lVar9 + lVar2;
        uVar4 = uVar4 + 1;
        lVar2 = *(long *)&this->media_fragment_;
        lVar3 = *(long *)(lVar2 + 0xd0 + lVar8);
        uVar6 = (*(long *)(lVar2 + 0xd8 + lVar8) - lVar3 >> 5) * 0x6db6db6db6db6db7;
        lVar7 = lVar7 + 0xe0;
      } while (uVar4 <= uVar6 && uVar6 - uVar4 != 0);
    }
    pvVar1 = *(void **)(lVar2 + lVar8 + 0x138);
    sVar5 = *(long *)(lVar2 + lVar8 + 0x140) - (long)pvVar1;
    if (sVar5 != 0) {
      memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start + lVar9,pvVar1,sVar5);
      lVar2 = *(long *)&this->media_fragment_;
    }
    pvVar1 = *(void **)(lVar2 + 0x1a0 + lVar8);
    sVar5 = *(long *)(lVar2 + 0x1a8 + lVar8) - (long)pvVar1;
    if (sVar5 != 0) {
      memmove((media_seg_dat->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_start + lVar9 + *(long *)(lVar2 + lVar8 + 0x100),
              pvVar1,sVar5);
    }
  }
  return __new_size;
}

Assistant:

uint64_t ingest_stream::get_media_segment_data(
		std::size_t index, std::vector<uint8_t> &media_seg_dat)
	{
		if (!(media_fragment_.size() > index))
			return 0;

		uint64_t ssize = media_fragment_[index].moof_box_.large_size_ + media_fragment_[index].mdat_box_.large_size_;
		media_seg_dat.resize(ssize);

		// copy emsgs
		size_t ptr_of = 0;
		for (int k = 0; k < media_fragment_[index].emsg_.size(); k++)
		{
			std::copy(media_fragment_[index].emsg_[k].box_data_.begin(),
				media_fragment_[index].emsg_[k].box_data_.end(),
				media_seg_dat.begin());
			ptr_of += media_fragment_[index].emsg_[k].size();
		}

		// copy moviefragmentbox
		std::copy(media_fragment_[index].moof_box_.box_data_.begin(), 
			      media_fragment_[index].moof_box_.box_data_.end(), 
			      media_seg_dat.begin() + ptr_of
	    );
		// copy mdat
		std::copy(media_fragment_[index].mdat_box_.box_data_.begin(), 
			      media_fragment_[index].mdat_box_.box_data_.end(), 
			      media_seg_dat.begin() + media_fragment_[index].moof_box_.large_size_ + ptr_of
	    );

		return ssize;
	}